

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

bool __thiscall Fossilize::ApplicationInfoFilter::Impl::filter_env_info(Impl *this,EnvInfo *info)

{
  _func_char_ptr_char_ptr_void_ptr *p_Var1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  char *__needle;
  char *env;
  EnvInfo *info_local;
  Impl *this_local;
  
  if (this->getenv_wrapper == (_func_char_ptr_char_ptr_void_ptr *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    p_Var1 = this->getenv_wrapper;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (*p_Var1)(pcVar3,this->getenv_userdata);
    if (pcVar3 == (char *)0x0) {
      this_local._7_1_ = false;
    }
    else if ((info->nonnull & 1U) == 0) {
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) && (bVar2 = std::operator==(&info->equals,pcVar3), bVar2)) {
        this_local._7_1_ = true;
      }
      else {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          __needle = (char *)std::__cxx11::string::c_str();
          pcVar3 = strstr(pcVar3,__needle);
          if (pcVar3 != (char *)0x0) {
            return true;
          }
        }
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ApplicationInfoFilter::Impl::filter_env_info(const EnvInfo &info) const
{
	if (!getenv_wrapper)
		return false;

	const char *env = getenv_wrapper(info.env.c_str(), getenv_userdata);
	if (!env)
		return false;

	if (info.nonnull)
		return true;
	else if (!info.equals.empty() && info.equals == env)
		return true;
	else if (!info.contains.empty() && strstr(env, info.contains.c_str()))
		return true;
	else
		return false;
}